

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * flatbuffers::GenText(Parser *parser,void *flatbuffer,string *_text)

{
  char *pcVar1;
  Table *local_30;
  Table *root;
  string *_text_local;
  void *flatbuffer_local;
  Parser *parser_local;
  
  if (parser->root_struct_def_ != (StructDef *)0x0) {
    if (((parser->opts).size_prefixed & 1U) == 0) {
      local_30 = GetRoot<flatbuffers::Table>(flatbuffer);
    }
    else {
      local_30 = GetSizePrefixedRoot<flatbuffers::Table,unsigned_int>(flatbuffer);
    }
    pcVar1 = GenerateTextImpl(parser,local_30,parser->root_struct_def_,_text);
    return pcVar1;
  }
  __assert_fail("parser.root_struct_def_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                ,0x19c,
                "const char *flatbuffers::GenText(const Parser &, const void *, std::string *)");
}

Assistant:

const char *GenText(const Parser &parser, const void *flatbuffer,
                    std::string *_text) {
  FLATBUFFERS_ASSERT(parser.root_struct_def_);  // call SetRootType()
  auto root = parser.opts.size_prefixed ? GetSizePrefixedRoot<Table>(flatbuffer)
                                        : GetRoot<Table>(flatbuffer);
  return GenerateTextImpl(parser, root, *parser.root_struct_def_, _text);
}